

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_node.cc
# Opt level: O3

RC __thiscall QL_Node::CheckConditions(QL_Node *this,char *recData)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  int iVar5;
  Cond *pCVar6;
  char cVar7;
  char *pcVar8;
  char *pcVar9;
  long lVar10;
  long lVar11;
  char *local_38;
  
  if (this->condIndex < 1) {
    return 0;
  }
  lVar11 = 0x2c;
  lVar10 = 0;
  do {
    pCVar6 = this->condList;
    iVar1 = *(int *)((long)pCVar6 + lVar11 + -0x2c);
    iVar2 = *(int *)((long)&pCVar6->offset1 + lVar11);
    iVar3 = *(int *)((long)pCVar6 + lVar11 + -8);
    if (*(char *)((long)pCVar6 + lVar11 + -0x1c) == '\0') {
      if (iVar2 != 2) {
LAB_00112cf9:
        pcVar9 = recData + *(int *)((long)pCVar6 + lVar11 + -0xc);
        goto LAB_00112d04;
      }
      iVar2 = *(int *)((long)pCVar6 + lVar11 + -4);
      if (iVar3 == iVar2) goto LAB_00112cf9;
      iVar5 = *(int *)((long)pCVar6 + lVar11 + -0xc);
      if (iVar3 < iVar2) {
        pcVar9 = (char *)calloc(1,(long)iVar3 + 1);
        memcpy(pcVar9,recData + iVar1,(long)*(int *)((long)pCVar6 + lVar11 + -8));
        pcVar9[*(int *)((long)pCVar6 + lVar11 + -8)] = '\0';
        pcVar8 = recData + iVar5;
        iVar1 = *(int *)((long)pCVar6 + lVar11 + -8);
        uVar4 = *(undefined4 *)((long)&pCVar6->offset1 + lVar11);
        local_38 = pcVar9;
      }
      else {
        pcVar8 = (char *)calloc(1,(long)iVar2 + 1);
        memcpy(pcVar8,recData + iVar5,(long)*(int *)((long)pCVar6 + lVar11 + -4));
        pcVar8[*(int *)((long)pCVar6 + lVar11 + -4)] = '\0';
        pcVar9 = recData + iVar1;
        iVar1 = *(int *)((long)pCVar6 + lVar11 + -4);
        uVar4 = *(undefined4 *)((long)&pCVar6->offset1 + lVar11);
        local_38 = pcVar8;
      }
      cVar7 = (**(code **)((long)pCVar6 + lVar11 + -0x24))(pcVar9,pcVar8,uVar4,iVar1 + 1);
LAB_00112e7f:
      free(local_38);
    }
    else {
      if (iVar2 == 2) {
        iVar2 = *(int *)((long)pCVar6 + lVar11 + -4);
        if (iVar3 != iVar2) {
          if (iVar3 < iVar2) {
            pcVar8 = (char *)calloc(1,(long)iVar3 + 1);
            memcpy(pcVar8,recData + iVar1,(long)*(int *)((long)pCVar6 + lVar11 + -8));
            pcVar8[*(int *)((long)pCVar6 + lVar11 + -8)] = '\0';
            pcVar9 = *(char **)((long)pCVar6 + lVar11 + -0x14);
            uVar4 = *(undefined4 *)((long)&pCVar6->offset1 + lVar11);
            iVar1 = *(int *)((long)pCVar6 + lVar11 + -8);
            local_38 = pcVar8;
          }
          else {
            pcVar9 = (char *)calloc(1,(long)iVar2 + 1);
            memcpy(pcVar9,*(void **)((long)pCVar6 + lVar11 + -0x14),
                   (long)*(int *)((long)pCVar6 + lVar11 + -4));
            pcVar9[*(int *)((long)pCVar6 + lVar11 + -4)] = '\0';
            pcVar8 = recData + iVar1;
            iVar1 = *(int *)((long)pCVar6 + lVar11 + -4);
            uVar4 = *(undefined4 *)((long)&pCVar6->offset1 + lVar11);
            local_38 = pcVar9;
          }
          cVar7 = (**(code **)((long)pCVar6 + lVar11 + -0x24))(pcVar8,pcVar9,uVar4,iVar1 + 1);
          goto LAB_00112e7f;
        }
      }
      pcVar9 = *(char **)((long)pCVar6 + lVar11 + -0x14);
LAB_00112d04:
      cVar7 = (**(code **)((long)pCVar6 + lVar11 + -0x24))(recData + iVar1,pcVar9);
    }
    if (cVar7 == '\0') {
      return 0x197;
    }
    lVar10 = lVar10 + 1;
    lVar11 = lVar11 + 0x30;
    if (this->condIndex <= lVar10) {
      return 0;
    }
  } while( true );
}

Assistant:

RC QL_Node::CheckConditions(char *recData){
  RC rc = 0;
  for(int i = 0; i < condIndex; i++){
    int offset1 = condList[i].offset1;
    // If we are comparing this to a value
    if(! condList[i].isValue){
      // If it's not a string, or string of equal length, just compare
      if(condList[i].type != STRING || condList[i].length == condList[i].length2){
        int offset2 = condList[i].offset2;
        bool comp = condList[i].comparator((void *)(recData + offset1), (void *)(recData + offset2), 
          condList[i].type, condList[i].length);

        if(comp == false){
          return (QL_CONDNOTMET);
        }
      }
      // Depending on if the value or attribute is shorter, null terminate the shorter one and compare
      else if(condList[i].length < condList[i].length2){
        int offset2 = condList[i].offset2;
        char *shorter = (char*)malloc(condList[i].length + 1);
        memset((void *)shorter, 0, condList[i].length + 1);
        memcpy(shorter, recData + offset1, condList[i].length);
        shorter[condList[i].length] = '\0';
        bool comp = condList[i].comparator(shorter, (void*)(recData + offset2), condList[i].type, condList[i].length + 1);
        free(shorter);
        if(comp == false)
          return (QL_CONDNOTMET);
      }
      else{
        int offset2 = condList[i].offset2;
        char *shorter = (char*)malloc(condList[i].length2 + 1);
        memset((void*)shorter, 0, condList[i].length2 + 1);
        memcpy(shorter, recData + offset2, condList[i].length2);
        shorter[condList[i].length2] = '\0';
        bool comp = condList[i].comparator((void*)(recData + offset1), shorter, condList[i].type, condList[i].length2 +1);
        free(shorter);
        if(comp == false)
          return (QL_CONDNOTMET);
      }
    }
    // Else, we are comparing it to another attribute
    else{
      // If it's not a string, or string of equal length, just compare
      if(condList[i].type != STRING || condList[i].length == condList[i].length2){
        bool comp = condList[i].comparator((void *)(recData + offset1), condList[i].data, 
          condList[i].type, condList[i].length);

        if(comp == false)
          return (QL_CONDNOTMET);
      }
      // Depending on which one is shorter, null terminate the shorter one and compare
      else if(condList[i].length < condList[i].length2){
        char *shorter = (char*)malloc(condList[i].length + 1);
        memset((void *)shorter, 0, condList[i].length + 1);
        memcpy(shorter, recData + offset1, condList[i].length);
        shorter[condList[i].length] = '\0';
        bool comp = condList[i].comparator(shorter, condList[i].data, condList[i].type, condList[i].length + 1);
        free(shorter);
        if(comp == false)
          return (QL_CONDNOTMET);
      }
      else{
        char *shorter = (char*)malloc(condList[i].length2 + 1);
        memset((void*)shorter, 0, condList[i].length2 + 1);
        memcpy(shorter, condList[i].data, condList[i].length2);
        shorter[condList[i].length2] = '\0';
        bool comp = condList[i].comparator((void*)(recData + offset1), shorter, condList[i].type, condList[i].length2 +1);
        free(shorter);
        if(comp == false)
          return (QL_CONDNOTMET);
      }
    }
  }

  return (0);
}